

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O3

bool duckdb::ExpressionBinder::ContainsType(LogicalType *type,LogicalTypeId target)

{
  LogicalTypeId LVar1;
  bool bVar2;
  idx_t iVar3;
  LogicalType *pLVar4;
  idx_t iVar5;
  bool bVar6;
  
  LVar1 = type->id_;
  do {
    if (LVar1 == target) {
      return true;
    }
    switch(LVar1) {
    case STRUCT:
      iVar3 = StructType::GetChildCount(type);
      if (iVar3 == 0) {
        return false;
      }
      iVar5 = 0;
      do {
        pLVar4 = StructType::GetChildType(type,iVar5);
        bVar2 = ContainsType(pLVar4,target);
        if (bVar2) {
          return bVar2;
        }
        bVar6 = iVar3 - 1 != iVar5;
        iVar5 = iVar5 + 1;
      } while (bVar6);
      return bVar2;
    case LIST:
    case MAP:
      type = ListType::GetChildType(type);
      break;
    default:
      return false;
    case UNION:
      iVar3 = UnionType::GetMemberCount(type);
      if (iVar3 == 0) {
        return false;
      }
      iVar5 = 0;
      do {
        pLVar4 = UnionType::GetMemberType(type,iVar5);
        bVar2 = ContainsType(pLVar4,target);
        if (bVar2) {
          return bVar2;
        }
        bVar6 = iVar3 - 1 != iVar5;
        iVar5 = iVar5 + 1;
      } while (bVar6);
      return bVar2;
    case ARRAY:
      type = ArrayType::GetChildType(type);
    }
    LVar1 = type->id_;
  } while( true );
}

Assistant:

bool ExpressionBinder::ContainsType(const LogicalType &type, LogicalTypeId target) {
	if (type.id() == target) {
		return true;
	}
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		auto child_count = StructType::GetChildCount(type);
		for (idx_t i = 0; i < child_count; i++) {
			if (ContainsType(StructType::GetChildType(type, i), target)) {
				return true;
			}
		}
		return false;
	}
	case LogicalTypeId::UNION: {
		auto member_count = UnionType::GetMemberCount(type);
		for (idx_t i = 0; i < member_count; i++) {
			if (ContainsType(UnionType::GetMemberType(type, i), target)) {
				return true;
			}
		}
		return false;
	}
	case LogicalTypeId::LIST:
	case LogicalTypeId::MAP:
		return ContainsType(ListType::GetChildType(type), target);
	case LogicalTypeId::ARRAY:
		return ContainsType(ArrayType::GetChildType(type), target);
	default:
		return false;
	}
}